

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Poly1305_64.c
# Opt level: O0

void Hacl_Poly1305_64_update_last
               (Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *m,uint32_t len1)

{
  Hacl_Impl_Poly1305_64_State_poly1305_state st_00;
  int in_ECX;
  uint64_t *in_RDX;
  uint64_t *in_RDI;
  uint64_t *acc;
  uint64_t *h;
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut;
  uint64_t *in_stack_00000060;
  uint64_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ECX != 0) {
    st_00.h = in_RDI;
    st_00.r = in_RDX;
    Hacl_Impl_Poly1305_64_poly1305_process_last_block
              (st_00,(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
              );
  }
  Hacl_Impl_Poly1305_64_poly1305_last_pass(in_stack_00000060);
  return;
}

Assistant:

void
Hacl_Poly1305_64_update_last(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *m,
  uint32_t len1
)
{
  if (!((uint64_t)len1 == (uint64_t)0U))
    Hacl_Impl_Poly1305_64_poly1305_process_last_block(st, m, (uint64_t)len1);
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  Hacl_Impl_Poly1305_64_poly1305_last_pass(acc);
}